

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

rk_s32 kmpp_obj_test(KmppObj obj,char *name)

{
  MppTrieInfo *info_00;
  void *pvVar1;
  KmppEntry *tbl;
  MppTrieInfo *info;
  KmppObjImpl *impl;
  char *name_local;
  KmppObj obj_local;
  
  if (((obj == (KmppObj)0x0) || (*(long *)((long)obj + 0x10) == 0)) ||
     (info_00 = mpp_trie_get_info(*(MppTrie *)((long)obj + 0x10),name),
     info_00 == (MppTrieInfo *)0x0)) {
    obj_local._4_4_ = 0;
  }
  else {
    pvVar1 = mpp_trie_info_ctx(info_00);
    obj_local._4_4_ =
         (uint)((*(ulong *)(*(long *)((long)obj + 0x28) +
                           (long)(int)((*(ushort *)((long)pvVar1 + 6) & 0xffffffe0) / 8)) &
                1L << ((byte)*(undefined2 *)((long)pvVar1 + 6) & 0x1f)) != 0);
  }
  return obj_local._4_4_;
}

Assistant:

rk_s32 kmpp_obj_test(KmppObj obj, const char *name)
{
    KmppObjImpl *impl = (KmppObjImpl *)obj;

    if (impl && impl->trie) {
        MppTrieInfo *info = mpp_trie_get_info(impl->trie, name);

        if (info) {
            KmppEntry *tbl = (KmppEntry *)mpp_trie_info_ctx(info);

            return ENTRY_TEST_FLAG(tbl, impl->entry);;
        }
    }

    return 0;
}